

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_quadrature.cc
# Opt level: O3

tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *
lf::quad::GaussLegendre
          (tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,uint num_points)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  rep_type rVar10;
  exponent_type eVar11;
  bool bVar12;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> cVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  Scalar *pSVar17;
  type pnVar18;
  ulong uVar19;
  undefined4 in_register_00000034;
  scalar_t p2;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  result;
  scalar_t z1;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  stringstream ss;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_2e8
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_2d8
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_2c8
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_2b8
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_2a8
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_298
  ;
  cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  local_288;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_280
  ;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_270
  ;
  undefined1 local_260 [12];
  bool local_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  ulong local_240;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_238
  ;
  string local_228;
  ulong local_200;
  string local_1f8;
  ulong local_1d8;
  ulong local_1d0;
  tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_1c8;
  double local_1c0;
  cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0> local_1b8
  ;
  ostream local_1a8 [376];
  
  local_200 = CONCAT44(in_register_00000034,num_points);
  local_1c8 = __return_storage_ptr__;
  if (num_points == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"num_points must be positive.",0x1c);
    paVar1 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"num_points > 0","");
    paVar2 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1f8,&local_228,0x12,(string *)local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._0_8_ != &local_250) {
      operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"false","");
    local_228._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,"");
    local_260._0_8_ = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
    base::AssertionFailed(&local_1f8,&local_228,0x12,(string *)local_260);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1f8);
    abort();
  }
  if ((GaussLegendre(unsigned_int)::kPi == '\0') &&
     (iVar16 = __cxa_guard_acquire(&GaussLegendre(unsigned_int)::kPi), iVar16 != 0)) {
    pnVar18 = boost::math::constants::
              pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>>
                        ();
    GaussLegendre::kPi.m_backend.m_data.
    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
               )(pnVar18->m_backend).m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
    GaussLegendre::kPi.m_backend.m_exponent = (pnVar18->m_backend).m_exponent;
    GaussLegendre::kPi.m_backend.m_sign = (pnVar18->m_backend).m_sign;
    __cxa_guard_release(&GaussLegendre(unsigned_int)::kPi);
  }
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  uVar19 = local_200 & 0xffffffff;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1f8,uVar19);
  local_228._M_dataplus._M_p = (pointer)0x0;
  local_228._M_string_length = 0;
  local_1d0 = uVar19;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_228,uVar19);
  uVar15 = (int)local_200 + 1;
  if (1 < uVar15) {
    local_1d8 = (ulong)(uVar15 >> 1);
    local_1c0 = (double)(long)local_1d0 + 0.5;
    local_240 = 0;
    do {
      cVar13 = local_1b8;
      local_280.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_280.m_exponent = 0x7fffff8e;
      local_280.m_sign = false;
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8._13_3_ = cVar13._13_3_;
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,(double)(int)local_240 + 0.75);
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_280,&GaussLegendre::kPi.m_backend,&local_1b8);
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,local_1c0);
      boost::multiprecision::backends::
      eval_divide<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_280,&local_280,&local_1b8);
      local_270.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = local_280.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
      local_270.m_sign = local_280.m_sign;
      if (local_280.m_exponent == 0x7fffff90) {
        local_270.m_exponent = 0x7fffff90;
      }
      else if (local_280.m_exponent == 0x7fffff8f) {
        local_270.m_exponent = 0x7fffff8f;
      }
      else if (local_280.m_exponent == 0x7fffff8e) {
        local_270.m_exponent = 0x7fffff8e;
      }
      else {
        if (local_280.m_exponent < 0x7fffff8e) {
          if (-0x7fffff8f < local_280.m_exponent) {
            local_270.m_exponent = local_280.m_exponent;
            goto LAB_0035a0a5;
          }
          local_270.m_exponent = 0x7fffff8e;
        }
        else {
          local_270.m_exponent = 0x7fffff8f;
        }
        local_270.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
      }
LAB_0035a0a5:
      local_260._0_8_ = 0;
      local_260._8_4_ = 0x7fffff8e;
      local_254 = false;
      boost::multiprecision::default_ops::
      eval_cos<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                ((cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                  *)local_260,&local_270);
      local_270.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_270.m_exponent = 0x7fffff8e;
      local_270.m_sign = false;
      local_280.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_280.m_exponent = 0x7fffff8e;
      local_280.m_sign = false;
      do {
        local_2b8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
        local_2b8.m_exponent = 0;
        local_2b8.m_sign = false;
        boost::multiprecision::backends::
        cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
        assign_float<double>(&local_2b8,1.0);
        local_2d8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
        local_2d8.m_exponent = 0;
        local_2d8.m_sign = false;
        boost::multiprecision::backends::
        cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
        assign_float<double>(&local_2d8,0.0);
        uVar15 = 0;
        do {
          cVar13 = local_1b8;
          bVar12 = local_2d8.m_sign;
          eVar11 = local_2d8.m_exponent;
          rVar10.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_2d8.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
          local_2d8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_2b8.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
          local_288.m_data = (local_limb_type)(double)CONCAT44(0,uVar15);
          local_298.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )0;
          local_298.m_exponent = 0x7fffff8e;
          local_298.m_sign = false;
          local_1b8._0_12_ = ZEXT812(0);
          local_1b8._13_3_ = cVar13._13_3_;
          local_1b8.m_sign = false;
          local_2d8.m_exponent = local_2b8.m_exponent;
          local_2d8.m_sign = local_2b8.m_sign;
          boost::multiprecision::backends::
          cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
          assign_float<double>(&local_1b8,(double)local_288.m_data + (double)local_288.m_data + 1.0)
          ;
          boost::multiprecision::backends::
          eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                    (&local_298,
                     (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                      *)local_260,&local_1b8);
          boost::multiprecision::backends::
          eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                    (&local_298,&local_298,&local_2d8);
          local_2c8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_298.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
          local_2c8.m_sign = local_298.m_sign;
          if (local_298.m_exponent == 0x7fffff90) {
            local_2c8.m_exponent = 0x7fffff90;
          }
          else if (local_298.m_exponent == 0x7fffff8f) {
            local_2c8.m_exponent = 0x7fffff8f;
          }
          else if (local_298.m_exponent == 0x7fffff8e) {
            local_2c8.m_exponent = 0x7fffff8e;
          }
          else {
            if (local_298.m_exponent < 0x7fffff8e) {
              if (-0x7fffff8f < local_298.m_exponent) {
                local_2c8.m_exponent = local_298.m_exponent;
                goto LAB_0035a260;
              }
              local_2c8.m_exponent = 0x7fffff8e;
            }
            else {
              local_2c8.m_exponent = 0x7fffff8f;
            }
            local_2c8.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       )0;
          }
LAB_0035a260:
          local_2a8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )0;
          local_2a8.m_exponent = 0x7fffff8e;
          local_2a8.m_sign = false;
          if (eVar11 == 0x7fffff90) {
            local_2a8.m_exponent = 0x7fffff90;
LAB_0035a2cc:
            local_2a8.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = rVar10.
                      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
            local_2a8.m_sign = bVar12;
          }
          else if (eVar11 == 0x7fffff8f) {
            if (uVar15 == 0) {
              std::
              numeric_limits<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
              ::quiet_NaN();
              local_2a8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = local_1b8.m_data.
                        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
              local_2a8.m_sign = local_1b8.m_sign;
              local_2a8.m_exponent = local_1b8.m_exponent;
              if (local_1b8.m_exponent == 0x7fffff90) {
                local_2a8.m_exponent = 0x7fffff90;
              }
              else if (local_1b8.m_exponent == 0x7fffff8f) {
                local_2a8.m_exponent = 0x7fffff8f;
              }
              else if (local_1b8.m_exponent == 0x7fffff8e) {
                local_2a8.m_exponent = 0x7fffff8e;
              }
              else {
                if (local_1b8.m_exponent < 0x7fffff8e) {
                  if (-0x7fffff8f < local_1b8.m_exponent) goto LAB_0035a325;
                  local_2a8.m_exponent = 0x7fffff8e;
                }
                else {
                  local_2a8.m_exponent = 0x7fffff8f;
                }
                local_2a8.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           )0;
              }
            }
            else {
              local_2a8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = rVar10.
                        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                        .m_data;
              local_2a8.m_exponent = 0x7fffff8f;
              local_2a8.m_sign = bVar12;
            }
          }
          else {
            if (eVar11 == 0x7fffff8e) goto LAB_0035a2cc;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = rVar10.
                           super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           .m_data;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = CONCAT44(0,uVar15);
            local_1b8 = (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                         )(auVar3 * auVar5);
            local_2a8.m_exponent = eVar11;
            boost::multiprecision::backends::
            copy_and_round<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_int_backend<114UL,_114UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>_>
                      (&local_2a8,
                       (cpp_int_backend<114UL,_114UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                        *)&local_1b8,0x39);
            boost::multiprecision::backends::
            cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
            ::check_invariants(&local_2a8);
            local_2a8.m_sign = bVar12;
          }
LAB_0035a325:
          if (local_2c8.m_sign == local_2a8.m_sign) {
            boost::multiprecision::backends::
            do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                      (&local_2c8,&local_2c8,&local_2a8);
          }
          else {
            boost::multiprecision::backends::
            do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                      (&local_2c8,&local_2c8,&local_2a8);
          }
          uVar14 = local_1b8._8_8_;
          local_2e8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_2c8.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
          local_2e8.m_sign = local_2c8.m_sign;
          if (local_2c8.m_exponent == 0x7fffff90) {
            local_2e8.m_exponent = 0x7fffff90;
          }
          else if (local_2c8.m_exponent == 0x7fffff8f) {
            local_2e8.m_exponent = 0x7fffff8f;
          }
          else if (local_2c8.m_exponent == 0x7fffff8e) {
            local_2e8.m_exponent = 0x7fffff8e;
          }
          else {
            if (local_2c8.m_exponent < 0x7fffff8e) {
              if (-0x7fffff8f < local_2c8.m_exponent) {
                local_2e8.m_exponent = local_2c8.m_exponent;
                goto LAB_0035a42b;
              }
              local_2e8.m_exponent = 0x7fffff8e;
            }
            else {
              local_2e8.m_exponent = 0x7fffff8f;
            }
            local_2e8.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       )0;
          }
LAB_0035a42b:
          local_1b8._0_12_ = ZEXT812(0);
          local_1b8._13_3_ = SUB83(uVar14,5);
          local_1b8.m_sign = false;
          boost::multiprecision::backends::
          cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
          assign_float<double>(&local_1b8,(double)local_288.m_data + 1.0);
          boost::multiprecision::backends::
          eval_divide<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                    (&local_2e8,&local_2e8,&local_1b8);
          local_2b8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )(cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       )local_2e8.m_data;
          if (local_2e8.m_exponent == 0x7fffff8e) {
LAB_0035a4ba:
            local_2b8.m_exponent = 0x7fffff8e;
          }
          else if (local_2e8.m_exponent == 0x7fffff8f) {
LAB_0035a4a4:
            local_2b8.m_exponent = 0x7fffff8f;
          }
          else if (local_2e8.m_exponent == 0x7fffff90) {
            local_2b8.m_exponent = 0x7fffff90;
          }
          else {
            if (0x7fffff8d < local_2e8.m_exponent) {
              local_2b8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )0;
              goto LAB_0035a4a4;
            }
            if (local_2e8.m_exponent < -0x7fffff8e) {
              local_2b8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )0;
              goto LAB_0035a4ba;
            }
            local_2b8.m_exponent = local_2e8.m_exponent;
          }
          local_2b8.m_sign = local_2e8.m_sign;
          uVar15 = uVar15 + 1;
        } while ((uint)local_200 != uVar15);
        local_298.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
        local_298.m_exponent = 0x7fffff8e;
        local_298.m_sign = false;
        boost::multiprecision::backends::
        eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                  (&local_298,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,&local_2b8);
        if (local_298.m_sign == local_2d8.m_sign) {
          boost::multiprecision::backends::
          do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                    (&local_298,&local_298,&local_2d8);
        }
        else {
          boost::multiprecision::backends::
          do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                    (&local_298,&local_298,&local_2d8);
        }
        bVar12 = local_298.m_sign;
        local_2c8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = local_298.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
        local_2c8.m_sign = local_298.m_sign;
        if (local_298.m_exponent == 0x7fffff8e) {
LAB_0035a637:
          local_2c8.m_exponent = 0x7fffff8e;
LAB_0035a64f:
          local_2e8.m_exponent = 0x7fffff8e;
          local_2e8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_2c8.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
        }
        else {
          if (local_298.m_exponent == 0x7fffff8f) {
LAB_0035a5fe:
            local_2c8.m_exponent = 0x7fffff8f;
          }
          else {
            if (local_298.m_exponent == 0x7fffff90) {
              local_2c8.m_exponent = 0x7fffff90;
LAB_0035a5d9:
              local_2e8.m_exponent = 0x7fffff90;
              local_2e8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )(cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           )local_2c8.m_data;
              goto LAB_0035a657;
            }
            if (0x7fffff8d < local_298.m_exponent) {
              local_2c8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )0;
              goto LAB_0035a5fe;
            }
            if (local_298.m_exponent < -0x7fffff8e) {
              local_2c8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )0;
              goto LAB_0035a637;
            }
            local_2c8.m_exponent = local_298.m_exponent;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_298.m_data.
                           super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           .m_data;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_1d0;
            local_1b8 = (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                         )(auVar4 * auVar6);
            boost::multiprecision::backends::
            copy_and_round<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_int_backend<114UL,_114UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>_>
                      (&local_2c8,
                       (cpp_int_backend<114UL,_114UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                        *)&local_1b8,0x39);
            boost::multiprecision::backends::
            cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
            ::check_invariants(&local_2c8);
            local_2e8.m_exponent = local_2c8.m_exponent;
            local_2e8.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = local_2c8.m_data.
                      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data;
            if (local_2c8.m_exponent == 0x7fffff90) goto LAB_0035a5d9;
            if (local_2c8.m_exponent != 0x7fffff8f) {
              if (local_2c8.m_exponent == 0x7fffff8e) goto LAB_0035a64f;
              if (local_2c8.m_exponent < 0x7fffff8e) {
                if (-0x7fffff8f < local_2c8.m_exponent) goto LAB_0035a657;
                local_2e8.m_exponent = 0x7fffff8e;
              }
              else {
                local_2e8.m_exponent = 0x7fffff8f;
              }
              local_2e8.m_data.
              super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                         )0;
              goto LAB_0035a657;
            }
          }
          local_2e8.m_exponent = 0x7fffff8f;
          local_2e8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = local_2c8.m_data.
                    super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data;
        }
LAB_0035a657:
        local_2e8.m_sign = bVar12;
        local_238.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
        local_238.m_exponent = 0x7fffff8e;
        local_238.m_sign = false;
        local_2c8.m_sign = local_2e8.m_sign;
        boost::multiprecision::backends::
        eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                  (&local_238,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260);
        cVar13 = local_1b8;
        local_1b8._0_12_ = ZEXT812(0);
        local_1b8._13_3_ = cVar13._13_3_;
        local_1b8.m_sign = false;
        boost::multiprecision::backends::
        cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
        assign_float<double>(&local_1b8,1.0);
        if (local_238.m_sign == local_1b8.m_sign) {
          boost::multiprecision::backends::
          do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                    (&local_238,&local_238,&local_1b8);
        }
        else {
          boost::multiprecision::backends::
          do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                    (&local_238,&local_238,&local_1b8);
        }
        local_2a8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = local_238.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
        local_2a8.m_sign = local_238.m_sign;
        if (local_238.m_exponent == 0x7fffff90) {
          local_2a8.m_exponent = 0x7fffff90;
        }
        else if (local_238.m_exponent == 0x7fffff8f) {
          local_2a8.m_exponent = 0x7fffff8f;
        }
        else if (local_238.m_exponent == 0x7fffff8e) {
          local_2a8.m_exponent = 0x7fffff8e;
        }
        else {
          if (local_238.m_exponent < 0x7fffff8e) {
            if (-0x7fffff8f < local_238.m_exponent) {
              local_2a8.m_exponent = local_238.m_exponent;
              goto LAB_0035a7fb;
            }
            local_2a8.m_exponent = 0x7fffff8e;
          }
          else {
            local_2a8.m_exponent = 0x7fffff8f;
          }
          local_2a8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )0;
        }
LAB_0035a7fb:
        boost::multiprecision::backends::
        eval_divide<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                  (&local_2e8,&local_2e8,&local_2a8);
        cVar13 = local_1b8;
        local_280.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )(cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )local_2e8.m_data;
        if (local_2e8.m_exponent == 0x7fffff8e) {
LAB_0035a85b:
          local_280.m_exponent = 0x7fffff8e;
        }
        else if (local_2e8.m_exponent == 0x7fffff8f) {
LAB_0035a841:
          local_280.m_exponent = 0x7fffff8f;
        }
        else if (local_2e8.m_exponent == 0x7fffff90) {
          local_280.m_exponent = 0x7fffff90;
        }
        else {
          if (0x7fffff8d < local_2e8.m_exponent) {
            local_280.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       )0;
            goto LAB_0035a841;
          }
          if (local_2e8.m_exponent < -0x7fffff8e) {
            local_280.m_data.
            super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                       )0;
            goto LAB_0035a85b;
          }
          local_280.m_exponent = local_2e8.m_exponent;
        }
        local_280.m_sign = local_2e8.m_sign;
        local_270.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )(cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )local_260._0_8_;
        local_270.m_exponent = local_260._8_4_;
        local_270.m_sign = local_254;
        local_1b8._0_12_ = ZEXT412(0x7fffff8e) << 0x40;
        local_1b8._13_3_ = cVar13._13_3_;
        local_1b8.m_sign = false;
        boost::multiprecision::backends::
        eval_divide<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                  (&local_1b8,&local_2b8,&local_280);
        if (local_1b8.m_sign == local_270.m_sign) {
          boost::multiprecision::backends::
          do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                    (&local_1b8,&local_1b8,&local_270);
        }
        else {
          boost::multiprecision::backends::
          do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                    (&local_1b8,&local_1b8,&local_270);
        }
        local_260._8_4_ = local_1b8.m_exponent;
        local_260._0_8_ =
             local_1b8.m_data.
             super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data;
        if (local_1b8.m_exponent == 0x7fffff90) {
          local_260._8_4_ = 0x7fffff90;
          local_254 = local_1b8.m_sign;
        }
        else {
          local_254 = (bool)(local_1b8.m_sign ^ 1);
          local_1b8.m_sign = local_254;
          if (local_260._8_4_ == 0x7fffff8e) {
LAB_0035a973:
            local_260._8_4_ = 0x7fffff8e;
          }
          else {
            if (local_260._8_4_ != 0x7fffff8f) {
              if ((int)local_260._8_4_ < 0x7fffff8e) {
                if (-0x7fffff8f < (int)local_260._8_4_) {
                  goto LAB_0035a980;
                }
                local_260._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                goto LAB_0035a973;
              }
              local_260._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
            }
            local_260._8_4_ = 0x7fffff8f;
          }
        }
LAB_0035a980:
        local_2d8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
        local_2d8.m_exponent = 0x7fffff8e;
        local_2d8.m_sign = false;
        if (local_254 == local_270.m_sign) {
          boost::multiprecision::backends::
          do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                    (&local_2d8,
                     (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                      *)local_260,&local_270);
        }
        else {
          boost::multiprecision::backends::
          do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                    (&local_2d8,
                     (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                      *)local_260,&local_270);
        }
        uVar14 = local_1b8._8_8_;
        local_2b8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = local_2d8.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
        local_2b8.m_exponent = local_2d8.m_exponent;
        local_2b8.m_sign = false;
        if (local_2d8.m_exponent == 0x7fffff90) break;
        local_1b8._0_12_ = ZEXT812(0);
        local_1b8._13_3_ = SUB83(uVar14,5);
        local_1b8.m_sign = false;
        boost::multiprecision::backends::
        cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
        assign_float<double>(&local_1b8,1e-17);
        iVar16 = boost::multiprecision::backends::
                 cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                 ::compare(&local_2b8,&local_1b8);
      } while (0 < iVar16);
      uVar14 = local_1b8._8_8_;
      local_2e8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_4_ = 1;
      local_2d8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_2d8.m_exponent = 0x7fffff8e;
      local_2d8.m_sign = false;
      local_1b8._0_12_ = ZEXT412(0x7fffff8e) << 0x40;
      local_1b8._13_3_ = SUB83(uVar14,5);
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>::operator=
                ((cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>
                  *)&local_1b8,(int *)&local_2e8);
      if (local_254 == local_1b8.m_sign) {
        boost::multiprecision::backends::
        do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                  (&local_2d8,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,&local_1b8);
      }
      else {
        boost::multiprecision::backends::
        do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                  (&local_2d8,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,&local_1b8);
      }
      uVar14 = local_1b8._8_8_;
      if ((local_2d8.m_exponent != 0x7fffff90) &&
         ((local_2d8.m_exponent != 0x7fffff8e ||
          ((uint)local_2e8.m_data.
                 super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 .m_data >> 0x1f != (uint)local_254)))) {
        local_2d8.m_sign = (bool)(local_2d8.m_sign ^ 1);
      }
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8._13_3_ = SUB83(uVar14,5);
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,0.5);
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_2d8,&local_2d8,&local_1b8);
      local_2b8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = local_2d8.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
      local_2b8.m_sign = local_2d8.m_sign;
      if (local_2d8.m_exponent == 0x7fffff90) {
        local_2b8.m_exponent = 0x7fffff90;
      }
      else if (local_2d8.m_exponent == 0x7fffff8f) {
        local_2b8.m_exponent = 0x7fffff8f;
      }
      else if (local_2d8.m_exponent == 0x7fffff8e) {
        local_2b8.m_exponent = 0x7fffff8e;
      }
      else {
        if (local_2d8.m_exponent < 0x7fffff8e) {
          if (-0x7fffff8f < local_2d8.m_exponent) {
            local_2b8.m_exponent = local_2d8.m_exponent;
            goto LAB_0035abce;
          }
          local_2b8.m_exponent = 0x7fffff8e;
        }
        else {
          local_2b8.m_exponent = 0x7fffff8f;
        }
        local_2b8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
      }
LAB_0035abce:
      auVar7._8_8_ = 0;
      auVar7._0_4_ = local_1b8.m_exponent;
      auVar7[4] = local_1b8.m_sign;
      auVar7._5_3_ = local_1b8._13_3_;
      local_1b8 = (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                   )(auVar7 << 0x40);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::convert_to_imp<double>
                ((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_2b8,(double *)&local_1b8);
      local_288 = local_1b8.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_1f8,
                           local_240);
      cVar13 = local_1b8;
      *pSVar17 = (Scalar)local_288.m_data;
      local_2e8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_4_ = 1;
      local_2d8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_2d8.m_exponent = 0x7fffff8e;
      local_2d8.m_sign = false;
      local_1b8._0_12_ = ZEXT412(0x7fffff8e) << 0x40;
      local_1b8._13_3_ = cVar13._13_3_;
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>::operator=
                ((cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>
                  *)&local_1b8,(int *)&local_2e8);
      if (local_254 == local_1b8.m_sign) {
        boost::multiprecision::backends::
        do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                  (&local_2d8,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,&local_1b8);
      }
      else {
        boost::multiprecision::backends::
        do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                  (&local_2d8,
                   (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                    *)local_260,&local_1b8);
      }
      uVar14 = local_1b8._8_8_;
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8._13_3_ = SUB83(uVar14,5);
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,0.5);
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_2d8,&local_2d8,&local_1b8);
      local_2b8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = local_2d8.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
      local_2b8.m_sign = local_2d8.m_sign;
      if (local_2d8.m_exponent == 0x7fffff90) {
        local_2b8.m_exponent = 0x7fffff90;
      }
      else if (local_2d8.m_exponent == 0x7fffff8f) {
        local_2b8.m_exponent = 0x7fffff8f;
      }
      else if (local_2d8.m_exponent == 0x7fffff8e) {
        local_2b8.m_exponent = 0x7fffff8e;
      }
      else {
        if (local_2d8.m_exponent < 0x7fffff8e) {
          if (-0x7fffff8f < local_2d8.m_exponent) {
            local_2b8.m_exponent = local_2d8.m_exponent;
            goto LAB_0035ad3d;
          }
          local_2b8.m_exponent = 0x7fffff8e;
        }
        else {
          local_2b8.m_exponent = 0x7fffff8f;
        }
        local_2b8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
      }
LAB_0035ad3d:
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_1b8.m_exponent;
      auVar8[4] = local_1b8.m_sign;
      auVar8._5_3_ = local_1b8._13_3_;
      local_1b8 = (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                   )(auVar8 << 0x40);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::convert_to_imp<double>
                ((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_2b8,(double *)&local_1b8);
      local_288 = local_1b8.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      uVar19 = (ulong)(~(uint)local_240 + (uint)local_200);
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_1f8,
                           uVar19);
      *pSVar17 = (Scalar)local_288.m_data;
      local_298.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_298.m_exponent = 0x7fffff8e;
      local_298.m_sign = false;
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_298,
                 (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                  *)local_260,
                 (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                  *)local_260);
      cVar13 = local_1b8;
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8._13_3_ = cVar13._13_3_;
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,1.0);
      if (local_298.m_sign == local_1b8.m_sign) {
        boost::multiprecision::backends::
        do_eval_subtract<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                  (&local_298,&local_298,&local_1b8);
      }
      else {
        boost::multiprecision::backends::
        do_eval_add<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>_>
                  (&local_298,&local_298,&local_1b8);
      }
      if (local_298.m_exponent == 0x7fffff90) {
        local_2c8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = local_298.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
        local_2c8.m_exponent = 0x7fffff90;
      }
      else {
        local_298.m_sign = (bool)(local_298.m_sign ^ 1);
        local_2c8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = local_298.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
        if (local_298.m_exponent == 0x7fffff8f) {
          local_2c8.m_exponent = 0x7fffff8f;
        }
        else if (local_298.m_exponent == 0x7fffff8e) {
          local_2c8.m_exponent = 0x7fffff8e;
        }
        else {
          if (local_298.m_exponent < 0x7fffff8e) {
            if (-0x7fffff8f < local_298.m_exponent) {
              local_2c8.m_exponent = local_298.m_exponent;
              goto LAB_0035aea5;
            }
            local_2c8.m_exponent = 0x7fffff8e;
          }
          else {
            local_2c8.m_exponent = 0x7fffff8f;
          }
          local_2c8.m_data.
          super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
          .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     )0;
        }
      }
LAB_0035aea5:
      local_2c8.m_sign = local_298.m_sign;
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_2c8,&local_2c8,&local_280);
      local_2e8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = local_2c8.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
      local_2e8.m_sign = local_2c8.m_sign;
      if (local_2c8.m_exponent == 0x7fffff90) {
        local_2e8.m_exponent = 0x7fffff90;
      }
      else if (local_2c8.m_exponent == 0x7fffff8f) {
        local_2e8.m_exponent = 0x7fffff8f;
      }
      else if (local_2c8.m_exponent == 0x7fffff8e) {
        local_2e8.m_exponent = 0x7fffff8e;
      }
      else {
        if (local_2c8.m_exponent < 0x7fffff8e) {
          if (-0x7fffff8f < local_2c8.m_exponent) {
            local_2e8.m_exponent = local_2c8.m_exponent;
            goto LAB_0035af28;
          }
          local_2e8.m_exponent = 0x7fffff8e;
        }
        else {
          local_2e8.m_exponent = 0x7fffff8f;
        }
        local_2e8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
      }
LAB_0035af28:
      boost::multiprecision::backends::
      eval_multiply<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_2e8,&local_2e8,&local_280);
      cVar13 = local_1b8;
      local_2d8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = local_2e8.m_data.
                super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
      local_2d8.m_sign = local_2e8.m_sign;
      if (local_2e8.m_exponent == 0x7fffff90) {
        local_2d8.m_exponent = 0x7fffff90;
      }
      else if (local_2e8.m_exponent == 0x7fffff8f) {
        local_2d8.m_exponent = 0x7fffff8f;
      }
      else if (local_2e8.m_exponent == 0x7fffff8e) {
        local_2d8.m_exponent = 0x7fffff8e;
      }
      else {
        if (local_2e8.m_exponent < 0x7fffff8e) {
          if (-0x7fffff8f < local_2e8.m_exponent) {
            local_2d8.m_exponent = local_2e8.m_exponent;
            goto LAB_0035afaa;
          }
          local_2d8.m_exponent = 0x7fffff8e;
        }
        else {
          local_2d8.m_exponent = 0x7fffff8f;
        }
        local_2d8.m_data.
        super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   )0;
      }
LAB_0035afaa:
      local_2b8.m_data.
      super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data = (cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 )0;
      local_2b8.m_exponent = 0x7fffff8e;
      local_2b8.m_sign = false;
      local_1b8._0_12_ = ZEXT812(0);
      local_1b8._13_3_ = cVar13._13_3_;
      local_1b8.m_sign = false;
      boost::multiprecision::backends::
      cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>::
      assign_float<double>(&local_1b8,1.0);
      boost::multiprecision::backends::
      eval_divide<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0,_void,_int,_0,_0,_void,_int,_0,_0>
                (&local_2b8,&local_1b8,&local_2d8);
      auVar9._8_8_ = 0;
      auVar9._0_4_ = local_1b8.m_exponent;
      auVar9[4] = local_1b8.m_sign;
      auVar9._5_3_ = local_1b8._13_3_;
      local_1b8 = (cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>
                   )(auVar9 << 0x40);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::convert_to_imp<double>
                ((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_2b8,(double *)&local_1b8);
      local_288 = local_1b8.m_data.
                  super_cpp_int_base<57UL,_57UL,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                  .m_data;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_228,
                           local_240);
      *pSVar17 = (Scalar)local_288.m_data;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_228,
                           local_240);
      local_288.m_data = (local_limb_type)*pSVar17;
      pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_228,
                           uVar19);
      *pSVar17 = (Scalar)local_288.m_data;
      local_240 = local_240 + 1;
    } while (local_240 != local_1d8);
  }
  (local_1c8->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  ).super__Tuple_impl<1UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_228._M_dataplus._M_p;
  (local_1c8->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  ).super__Tuple_impl<1UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_228._M_string_length;
  (local_1c8->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  ).super__Head_base<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_1f8._M_dataplus._M_p;
  (local_1c8->
  super__Tuple_impl<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  ).super__Head_base<0UL,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_1f8._M_string_length;
  return local_1c8;
}

Assistant:

std::tuple<Eigen::VectorXd, Eigen::VectorXd> GaussLegendre(
    unsigned num_points) {
  LF_ASSERT_MSG(num_points > 0, "num_points must be positive.");

  using scalar_t =
      boost::multiprecision::number<boost::multiprecision::cpp_bin_float<
          57, boost::multiprecision::digit_base_2>>;

  static const scalar_t kPi = boost::math::constants::pi<scalar_t>();

  Eigen::VectorXd points(num_points);
  Eigen::VectorXd weights(num_points);

  // the roots are symmetric in the interval, so we only have to find half of
  // them
  const unsigned int m = (num_points + 1) / 2;

  // approximation for the roots:
  for (unsigned int i = 0; i < m; ++i) {
    // initial guess for the i-th root:
    scalar_t z = cos(kPi * (i + 0.75) / (num_points + 0.5));
    scalar_t z1;
    scalar_t pp;

    // start of newton
    do {
      // calculate value of legendre polynomial at z using recurrence relation:
      scalar_t p1 = 1.0;
      scalar_t p2 = 0.0;
      scalar_t p3;

      for (unsigned int j = 0; j < num_points; ++j) {
        p3 = p2;
        p2 = p1;
        p1 = ((2.0 * j + 1.) * z * p2 - j * p3) / (j + 1.);
      }

      // p1 is now the value of the legendre polynomial at z. Next we compute
      // its derivative using a standard relation involving also p2, the
      // polynomial of one lower order:
      pp = num_points * (z * p1 - p2) / (z * z - 1.0);

      z1 = z;
      z = z1 - p1 / pp;
    } while (abs(z - z1) > 1e-17);

    points(i) = (0.5 * (1 - z)).convert_to<double>();
    points(num_points - 1 - i) = (0.5 * (1 + z)).convert_to<double>();
    weights(i) = (1. / ((1.0 - z * z) * pp * pp)).convert_to<double>();
    weights(num_points - 1 - i) = weights(i);
  }

  return {std::move(points), std::move(weights)};
}